

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O1

Type __thiscall wabt::Func::GetLocalType(Func *this,Index index)

{
  Type TVar1;
  long lVar2;
  uint uVar3;
  Index i;
  
  uVar3 = (uint)((ulong)(*(long *)(this + 0x78) - *(long *)(this + 0x70)) >> 2);
  i = index - uVar3;
  if (index < uVar3) {
    return (Type)*(Enum *)(*(long *)(this + 0x70) + (ulong)index * 4);
  }
  uVar3 = 0;
  for (lVar2 = *(long *)(this + 0xa0); lVar2 != *(long *)(this + 0xa8); lVar2 = lVar2 + 8) {
    uVar3 = uVar3 + *(int *)(lVar2 + 4);
  }
  if (i < uVar3) {
    TVar1 = LocalTypes::operator[]((LocalTypes *)(this + 0xa0),i);
    return (Type)TVar1.enum_;
  }
  __assert_fail("index < local_types.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/ir.cc",
                0xd5,"Type wabt::Func::GetLocalType(Index) const");
}

Assistant:

Type Func::GetLocalType(Index index) const {
  Index num_params = decl.GetNumParams();
  if (index < num_params) {
    return GetParamType(index);
  } else {
    index -= num_params;
    assert(index < local_types.size());
    return local_types[index];
  }
}